

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O1

int __thiscall
Assimp::JoinVerticesProcess::ProcessMesh(JoinVerticesProcess *this,aiMesh *pMesh,uint meshIndex)

{
  vector<Assimp::Vertex,std::allocator<Assimp::Vertex>> *pvVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  pointer pvVar4;
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *list;
  _Hash_node_base *p_Var5;
  iterator __position;
  aiAnimMesh *paVar6;
  pointer pVVar7;
  uint *puVar8;
  aiBone *paVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  undefined1 __src [8];
  bool bVar14;
  bool bVar15;
  uint n;
  uint uVar16;
  Base **ppBVar17;
  _func_int **pp_Var18;
  __node_base_ptr p_Var19;
  __node_base_ptr p_Var20;
  Logger *pLVar21;
  ostream *poVar22;
  aiVector3D *paVar23;
  aiColor4D *paVar24;
  long lVar25;
  aiVertexWeight *paVar26;
  aiMesh *paVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  __hash_code __code;
  ulong uVar31;
  long lVar32;
  __node_base_ptr p_Var33;
  uint a_2;
  ulong uVar34;
  uint a_1;
  aiFace *paVar35;
  SpatialSort *this_00;
  uint a;
  ulong uVar36;
  uint uVar37;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> uniqueVertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  vector<unsigned_int,_std::allocator<unsigned_int>_> replaceIndex;
  vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  uniqueAnimatedVertices;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  usedVertexIndices;
  Vertex v;
  SpatialSort _vertexFinder;
  Vertex aniMeshVertex;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> local_3c8;
  aiMesh *local_3a8;
  uint local_39c;
  ulong local_398;
  SpatialSort *local_390;
  ulong local_388;
  uint local_380;
  uint local_37c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_378;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_360;
  vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  local_348;
  long local_330;
  char *local_328;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_320;
  undefined1 local_2e8 [8];
  aiVertexWeight *paStack_2e0;
  aiVertexWeight *local_2d8;
  ios_base local_278 [272];
  SpatialSort local_168;
  Vertex local_140;
  
  if (pMesh->mNumVertices == 0 || pMesh->mVertices == (aiVector3D *)0x0) {
    return 0;
  }
  if (pMesh->mFaces == (aiFace *)0x0) {
    return 0;
  }
  if (pMesh->mNumFaces == 0) {
    return 0;
  }
  local_320._M_buckets = &local_320._M_single_bucket;
  local_320._M_bucket_count = 1;
  local_320._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_320._M_element_count = 0;
  local_320._M_rehash_policy._M_max_load_factor = 1.0;
  local_320._M_rehash_policy._M_next_resize = 0;
  local_320._M_single_bucket = (__node_base_ptr)0x0;
  local_3a8 = pMesh;
  local_39c = meshIndex;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::rehash(&local_320,(ulong)pMesh->mNumVertices);
  if (local_3a8->mNumFaces != 0) {
    uVar31 = 0;
    do {
      if (local_3a8->mFaces[uVar31].mNumIndices != 0) {
        paVar35 = local_3a8->mFaces + uVar31;
        lVar32 = 0;
        uVar36 = 0;
        do {
          local_2e8 = (undefined1  [8])&local_320;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_320,(long)paVar35->mIndices + lVar32,local_2e8);
          uVar36 = uVar36 + 1;
          lVar32 = lVar32 + 4;
        } while (uVar36 < paVar35->mNumIndices);
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 < local_3a8->mNumFaces);
  }
  paVar27 = local_3a8;
  local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (Vertex *)0x0;
  local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Vertex *)0x0;
  std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::reserve
            (&local_3c8,(ulong)local_3a8->mNumVertices);
  local_2e8._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_360,(ulong)paVar27->mNumVertices,(value_type_conflict1 *)local_2e8,
             (allocator_type *)&local_140);
  SpatialSort::SpatialSort(&local_168);
  list = &((this->super_BaseProcess).shared)->pmap;
  if (list == (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
               *)0x0) {
LAB_00305884:
    this_00 = (SpatialSort *)0x0;
  }
  else {
    local_2e8 = (undefined1  [8])0x0;
    ppBVar17 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                         (list,"$Spat",(Base **)local_2e8);
    if (*ppBVar17 == (Base *)0x0) {
      pp_Var18 = (_func_int **)0x0;
    }
    else {
      pp_Var18 = (*ppBVar17)[1]._vptr_Base;
    }
    if (pp_Var18 == (_func_int **)0x0) goto LAB_00305884;
    this_00 = (SpatialSort *)(*pp_Var18 + (ulong)local_39c * 0x30);
  }
  if (this_00 == (SpatialSort *)0x0) {
    SpatialSort::Fill(&local_168,paVar27->mVertices,paVar27->mNumVertices,0xc,true);
    this_00 = &local_168;
  }
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_378,10);
  lVar32 = 6;
  do {
    if (paVar27->mColors[lVar32 + -6] == (aiColor4D *)0x0) {
      bVar15 = true;
      if (lVar32 != 6) goto LAB_00305907;
      uVar31 = 0;
      goto LAB_003058ec;
    }
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0xe);
  bVar15 = true;
LAB_00305907:
  local_398 = (ulong)paVar27->mNumAnimMeshes;
  local_348.
  super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.
  super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((local_398 != 0) &&
     (std::
      vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
      ::resize(&local_348,local_398), paVar27->mNumAnimMeshes != 0)) {
    lVar32 = 0;
    uVar31 = 0;
    do {
      std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::reserve
                ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                 ((long)&((local_348.
                           super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar32),
                 (ulong)paVar27->mNumVertices);
      uVar31 = uVar31 + 1;
      lVar32 = lVar32 + 0x18;
    } while (uVar31 < paVar27->mNumAnimMeshes);
  }
  if (paVar27->mNumVertices != 0) {
    uVar31 = 0;
    local_390 = this_00;
    do {
      p_Var19 = local_320._M_buckets[uVar31 % local_320._M_bucket_count];
      p_Var20 = (__node_base_ptr)0x0;
      if (p_Var19 != (__node_base_ptr)0x0) {
        uVar36 = (ulong)*(uint *)&p_Var19->_M_nxt[1]._M_nxt;
        p_Var33 = p_Var19->_M_nxt;
        do {
          p_Var20 = p_Var19;
          if (uVar31 == uVar36) break;
          p_Var5 = p_Var33->_M_nxt;
          if (p_Var5 == (_Hash_node_base *)0x0) {
            p_Var20 = (__node_base_ptr)0x0;
            break;
          }
          uVar36 = (ulong)*(uint *)&p_Var5[1]._M_nxt;
          p_Var20 = (__node_base_ptr)0x0;
          p_Var19 = p_Var33;
          p_Var33 = p_Var5;
        } while (uVar36 % local_320._M_bucket_count == uVar31 % local_320._M_bucket_count);
      }
      if ((p_Var20 != (__node_base_ptr)0x0) && (p_Var20->_M_nxt != (_Hash_node_base *)0x0)) {
        uVar30 = (uint)uVar31;
        Vertex::Vertex((Vertex *)local_2e8,paVar27,uVar30);
        SpatialSort::FindIdenticalPositions(this_00,(aiVector3D *)local_2e8,&local_378);
        if (local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar37 = 0xffffffff;
        }
        else {
          uVar37 = 0xffffffff;
          uVar36 = 0;
          do {
            lVar32 = (long)(int)local_360.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start
                                [local_378.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar36]];
            bVar13 = true;
            if (-1 < lVar32) {
              local_388 = lVar32 * 0x110;
              local_37c = (uint)bVar15;
              local_330 = lVar32;
              bVar14 = anon_unknown.dwarf_d1e59::areVerticesEqual
                                 ((Vertex *)local_2e8,
                                  local_3c8.
                                  super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar32,bVar15);
              if (bVar14) {
                uVar16 = (uint)local_330;
                if (local_398 != 0) {
                  if (paVar27->mNumAnimMeshes == 0) {
                    bVar13 = false;
                  }
                  else {
                    lVar32 = 0;
                    uVar34 = 0;
                    bVar13 = false;
                    local_380 = uVar37;
                    do {
                      lVar28 = *(long *)((long)&((local_348.
                                                  super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                                )._M_impl.super__Vector_impl_data._M_start + lVar32)
                      ;
                      Vertex::Vertex(&local_140,paVar27->mAnimMeshes[uVar34],uVar30);
                      bVar14 = anon_unknown.dwarf_d1e59::areVerticesEqual
                                         (&local_140,(Vertex *)(lVar28 + local_388),
                                          SUB41(local_37c,0));
                      paVar27 = local_3a8;
                      if (!bVar14) {
                        bVar13 = true;
                        break;
                      }
                      uVar34 = uVar34 + 1;
                      lVar32 = lVar32 + 0x18;
                    } while (uVar34 < local_3a8->mNumAnimMeshes);
                    uVar16 = (uint)local_330;
                    uVar37 = local_380;
                  }
                  if (bVar13) goto LAB_00305b4c;
                }
                uVar37 = uVar16;
                bVar13 = false;
              }
            }
LAB_00305b4c:
          } while ((bVar13) &&
                  (uVar36 = (ulong)((int)uVar36 + 1),
                  uVar36 < (ulong)((long)local_378.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_378.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2)));
        }
        pVVar7 = local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (uVar37 == 0xffffffff) {
          local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar31] =
               (int)((ulong)((long)local_3c8.
                                   super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_3c8.
                                  super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0xf0f0f0f;
          if (local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::Vertex,std::allocator<Assimp::Vertex>>::
            _M_realloc_insert<Assimp::Vertex_const&>
                      ((vector<Assimp::Vertex,std::allocator<Assimp::Vertex>> *)&local_3c8,
                       (iterator)
                       local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Vertex *)local_2e8);
          }
          else {
            memcpy(local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Vertex *)local_2e8,0x110);
            local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
            super__Vector_impl_data._M_finish = pVVar7 + 1;
          }
          this_00 = local_390;
          if ((local_398 != 0) && (paVar27->mNumAnimMeshes != 0)) {
            lVar32 = 0;
            uVar36 = 0;
            do {
              Vertex::Vertex(&local_140,paVar27->mAnimMeshes[uVar36],uVar30);
              pvVar1 = (vector<Assimp::Vertex,std::allocator<Assimp::Vertex>> *)
                       ((long)&((local_348.
                                 super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                               _M_impl.super__Vector_impl_data._M_start + lVar32);
              __position._M_current =
                   *(Vertex **)
                    ((long)&((local_348.
                              super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                            _M_impl.super__Vector_impl_data._M_finish + lVar32);
              if (__position._M_current ==
                  *(Vertex **)
                   ((long)&((local_348.
                             super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                           _M_impl.super__Vector_impl_data._M_end_of_storage + lVar32)) {
                std::vector<Assimp::Vertex,std::allocator<Assimp::Vertex>>::
                _M_realloc_insert<Assimp::Vertex_const&>(pvVar1,__position,&local_140);
              }
              else {
                memcpy(__position._M_current,&local_140,0x110);
                pvVar1 = pvVar1 + 8;
                *(long *)pvVar1 = *(long *)pvVar1 + 0x110;
              }
              uVar36 = uVar36 + 1;
              lVar32 = lVar32 + 0x18;
            } while (uVar36 < paVar27->mNumAnimMeshes);
          }
        }
        else {
          local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar31] = uVar37 | 0x80000000;
          this_00 = local_390;
        }
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 < paVar27->mNumVertices);
  }
  bVar15 = DefaultLogger::isNullLogger();
  if ((!bVar15) && (pLVar21 = DefaultLogger::get(), pLVar21->m_Severity == VERBOSE)) {
    pLVar21 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[6]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
               (char (*) [6])0x6e994b);
    std::ostream::_M_insert<unsigned_long>((ulong)local_2e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8," (",2);
    local_328 = "unnamed";
    if ((paVar27->mName).length != 0) {
      local_328 = (paVar27->mName).data;
    }
    poVar22 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_2e8,&local_328);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,") | Verts in: ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22," out: ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22," | ~",4);
    std::ostream::_M_insert<double>
              ((double)(((float)(((long)local_3c8.
                                        super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_3c8.
                                        super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 0xf0f0f0f0f0f0f0f + (ulong)paVar27->mNumVertices) /
                        (float)paVar27->mNumVertices) * 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,"%",1);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar21,(char *)local_140.position._0_8_);
    if ((float *)local_140.position._0_8_ != &local_140.normal.y) {
      operator_delete((void *)local_140.position._0_8_,local_140.normal._4_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
    std::ios_base::~ios_base(local_278);
  }
  paVar27->mNumVertices =
       (int)((ulong)((long)local_3c8.
                           super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_3c8.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 4) * -0xf0f0f0f;
  if (paVar27->mVertices != (aiVector3D *)0x0) {
    operator_delete__(paVar27->mVertices);
    uVar30 = paVar27->mNumVertices;
    paVar23 = (aiVector3D *)operator_new__((ulong)uVar30 * 0xc);
    if (uVar30 != 0) {
      memset(paVar23,0,(((ulong)uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar27->mVertices = paVar23;
    if (uVar30 != 0) {
      lVar32 = 0;
      lVar28 = 0;
      uVar31 = 0;
      do {
        paVar23 = paVar27->mVertices;
        *(undefined4 *)((long)&paVar23->z + lVar28) =
             *(undefined4 *)
              ((long)(local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar32 + -0x28);
        *(undefined8 *)((long)&paVar23->x + lVar28) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3c8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar32)
        ;
        uVar31 = uVar31 + 1;
        lVar28 = lVar28 + 0xc;
        lVar32 = lVar32 + 0x110;
      } while (uVar31 < paVar27->mNumVertices);
    }
  }
  if (paVar27->mNormals != (aiVector3D *)0x0) {
    operator_delete__(paVar27->mNormals);
    uVar30 = paVar27->mNumVertices;
    paVar23 = (aiVector3D *)operator_new__((ulong)uVar30 * 0xc);
    if (uVar30 != 0) {
      memset(paVar23,0,(((ulong)uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar27->mNormals = paVar23;
    if (uVar30 != 0) {
      lVar32 = 0xc;
      lVar28 = 0;
      uVar31 = 0;
      do {
        paVar23 = paVar27->mNormals;
        *(undefined4 *)((long)&paVar23->z + lVar28) =
             *(undefined4 *)
              ((long)(local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar32 + -0x28);
        *(undefined8 *)((long)&paVar23->x + lVar28) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3c8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar32)
        ;
        uVar31 = uVar31 + 1;
        lVar28 = lVar28 + 0xc;
        lVar32 = lVar32 + 0x110;
      } while (uVar31 < paVar27->mNumVertices);
    }
  }
  if (paVar27->mTangents != (aiVector3D *)0x0) {
    operator_delete__(paVar27->mTangents);
    uVar30 = paVar27->mNumVertices;
    paVar23 = (aiVector3D *)operator_new__((ulong)uVar30 * 0xc);
    if (uVar30 != 0) {
      memset(paVar23,0,(((ulong)uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar27->mTangents = paVar23;
    if (uVar30 != 0) {
      lVar32 = 0x18;
      lVar28 = 0;
      uVar31 = 0;
      do {
        paVar23 = paVar27->mTangents;
        *(undefined4 *)((long)&paVar23->z + lVar28) =
             *(undefined4 *)
              ((long)(local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar32 + -0x28);
        *(undefined8 *)((long)&paVar23->x + lVar28) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3c8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar32)
        ;
        uVar31 = uVar31 + 1;
        lVar28 = lVar28 + 0xc;
        lVar32 = lVar32 + 0x110;
      } while (uVar31 < paVar27->mNumVertices);
    }
  }
  if (paVar27->mBitangents != (aiVector3D *)0x0) {
    operator_delete__(paVar27->mBitangents);
    uVar30 = paVar27->mNumVertices;
    paVar23 = (aiVector3D *)operator_new__((ulong)uVar30 * 0xc);
    if (uVar30 != 0) {
      memset(paVar23,0,(((ulong)uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar27->mBitangents = paVar23;
    if (uVar30 != 0) {
      lVar32 = 0x24;
      lVar28 = 0;
      uVar31 = 0;
      do {
        paVar23 = paVar27->mBitangents;
        *(undefined4 *)((long)&paVar23->z + lVar28) =
             *(undefined4 *)
              ((long)(local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar32 + -0x28);
        *(undefined8 *)((long)&paVar23->x + lVar28) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3c8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar32)
        ;
        uVar31 = uVar31 + 1;
        lVar28 = lVar28 + 0xc;
        lVar32 = lVar32 + 0x110;
      } while (uVar31 < paVar27->mNumVertices);
    }
  }
  lVar32 = 0x90;
  lVar28 = 0;
  do {
    if ((paVar27->mColors[lVar28] == (aiColor4D *)0x0) || (paVar27->mNumVertices == 0)) break;
    operator_delete__(paVar27->mColors[lVar28]);
    uVar30 = paVar27->mNumVertices;
    uVar31 = (ulong)uVar30 << 4;
    paVar24 = (aiColor4D *)operator_new__(uVar31);
    if (uVar30 == 0) {
      paVar27->mColors[lVar28] = paVar24;
    }
    else {
      memset(paVar24,0,uVar31);
      paVar27->mColors[lVar28] = paVar24;
      lVar29 = 0;
      uVar31 = 0;
      lVar25 = lVar32;
      do {
        puVar2 = (undefined4 *)
                 ((long)&(((Vertex *)
                          ((local_3c8.
                            super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                            _M_impl.super__Vector_impl_data._M_start)->texcoords + -4))->position).x
                 + lVar25);
        uVar10 = puVar2[1];
        uVar11 = puVar2[2];
        uVar12 = puVar2[3];
        puVar3 = (undefined4 *)((long)&paVar27->mColors[lVar28]->r + lVar29);
        *puVar3 = *puVar2;
        puVar3[1] = uVar10;
        puVar3[2] = uVar11;
        puVar3[3] = uVar12;
        uVar31 = uVar31 + 1;
        lVar29 = lVar29 + 0x10;
        lVar25 = lVar25 + 0x110;
      } while (uVar31 < paVar27->mNumVertices);
    }
    lVar28 = lVar28 + 1;
    lVar32 = lVar32 + 0x10;
  } while (lVar28 != 8);
  lVar32 = 0x30;
  lVar28 = 0;
  do {
    if ((paVar27->mTextureCoords[lVar28] == (aiVector3D *)0x0) || (paVar27->mNumVertices == 0))
    break;
    operator_delete__(paVar27->mTextureCoords[lVar28]);
    uVar30 = paVar27->mNumVertices;
    paVar23 = (aiVector3D *)operator_new__((ulong)uVar30 * 0xc);
    if (uVar30 != 0) {
      memset(paVar23,0,(((ulong)uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar27->mTextureCoords[lVar28] = paVar23;
    if (uVar30 != 0) {
      lVar29 = 0;
      uVar31 = 0;
      lVar25 = lVar32;
      do {
        paVar23 = paVar27->mTextureCoords[lVar28];
        *(undefined4 *)((long)&paVar23->z + lVar29) =
             *(undefined4 *)
              ((long)(local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start)->texcoords + lVar25 + -0x28);
        *(undefined8 *)((long)&paVar23->x + lVar29) =
             *(undefined8 *)
              ((long)&(((Vertex *)
                       ((local_3c8.
                         super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl
                         .super__Vector_impl_data._M_start)->texcoords + -4))->position).x + lVar25)
        ;
        uVar31 = uVar31 + 1;
        lVar29 = lVar29 + 0xc;
        lVar25 = lVar25 + 0x110;
      } while (uVar31 < paVar27->mNumVertices);
    }
    lVar28 = lVar28 + 1;
    lVar32 = lVar32 + 0xc;
  } while (lVar28 != 8);
  if ((local_398 != 0) && (paVar27->mNumAnimMeshes != 0)) {
    uVar31 = 0;
    do {
      paVar6 = paVar27->mAnimMeshes[uVar31];
      pvVar4 = local_348.
               super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar31;
      paVar6->mNumVertices =
           (int)((ulong)((long)(pvVar4->
                               super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar4->
                              super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 4) * -0xf0f0f0f;
      if (paVar6->mVertices != (aiVector3D *)0x0) {
        operator_delete__(paVar6->mVertices);
        uVar30 = paVar6->mNumVertices;
        uVar36 = (ulong)uVar30 * 0xc;
        paVar23 = (aiVector3D *)operator_new__(uVar36);
        if (uVar30 != 0) {
          memset(paVar23,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mVertices = paVar23;
        if (paVar6->mNumVertices != 0) {
          lVar32 = 0;
          lVar28 = 0;
          uVar36 = 0;
          do {
            pVVar7 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar23 = paVar6->mVertices;
            *(undefined4 *)((long)&paVar23->z + lVar28) =
                 *(undefined4 *)((long)pVVar7->texcoords + lVar32 + -0x28);
            *(undefined8 *)((long)&paVar23->x + lVar28) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar7->texcoords + -4))->position).x + lVar32)
            ;
            uVar36 = uVar36 + 1;
            lVar28 = lVar28 + 0xc;
            lVar32 = lVar32 + 0x110;
          } while (uVar36 < paVar6->mNumVertices);
        }
      }
      if (paVar6->mNormals != (aiVector3D *)0x0) {
        operator_delete__(paVar6->mNormals);
        uVar30 = paVar6->mNumVertices;
        uVar36 = (ulong)uVar30 * 0xc;
        paVar23 = (aiVector3D *)operator_new__(uVar36);
        if (uVar30 != 0) {
          memset(paVar23,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mNormals = paVar23;
        if (paVar6->mNumVertices != 0) {
          lVar32 = 0xc;
          lVar28 = 0;
          uVar36 = 0;
          do {
            pVVar7 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar23 = paVar6->mNormals;
            *(undefined4 *)((long)&paVar23->z + lVar28) =
                 *(undefined4 *)((long)pVVar7->texcoords + lVar32 + -0x28);
            *(undefined8 *)((long)&paVar23->x + lVar28) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar7->texcoords + -4))->position).x + lVar32)
            ;
            uVar36 = uVar36 + 1;
            lVar28 = lVar28 + 0xc;
            lVar32 = lVar32 + 0x110;
          } while (uVar36 < paVar6->mNumVertices);
        }
      }
      if (paVar6->mTangents != (aiVector3D *)0x0) {
        operator_delete__(paVar6->mTangents);
        uVar30 = paVar6->mNumVertices;
        uVar36 = (ulong)uVar30 * 0xc;
        paVar23 = (aiVector3D *)operator_new__(uVar36);
        if (uVar30 != 0) {
          memset(paVar23,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mTangents = paVar23;
        if (paVar6->mNumVertices != 0) {
          lVar32 = 0x18;
          lVar28 = 0;
          uVar36 = 0;
          do {
            pVVar7 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar23 = paVar6->mTangents;
            *(undefined4 *)((long)&paVar23->z + lVar28) =
                 *(undefined4 *)((long)pVVar7->texcoords + lVar32 + -0x28);
            *(undefined8 *)((long)&paVar23->x + lVar28) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar7->texcoords + -4))->position).x + lVar32)
            ;
            uVar36 = uVar36 + 1;
            lVar28 = lVar28 + 0xc;
            lVar32 = lVar32 + 0x110;
          } while (uVar36 < paVar6->mNumVertices);
        }
      }
      if (paVar6->mBitangents != (aiVector3D *)0x0) {
        operator_delete__(paVar6->mBitangents);
        uVar30 = paVar6->mNumVertices;
        uVar36 = (ulong)uVar30 * 0xc;
        paVar23 = (aiVector3D *)operator_new__(uVar36);
        if (uVar30 != 0) {
          memset(paVar23,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mBitangents = paVar23;
        if (paVar6->mNumVertices != 0) {
          lVar32 = 0x24;
          lVar28 = 0;
          uVar36 = 0;
          do {
            pVVar7 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar23 = paVar6->mBitangents;
            *(undefined4 *)((long)&paVar23->z + lVar28) =
                 *(undefined4 *)((long)pVVar7->texcoords + lVar32 + -0x28);
            *(undefined8 *)((long)&paVar23->x + lVar28) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar7->texcoords + -4))->position).x + lVar32)
            ;
            uVar36 = uVar36 + 1;
            lVar28 = lVar28 + 0xc;
            lVar32 = lVar32 + 0x110;
          } while (uVar36 < paVar6->mNumVertices);
        }
      }
      lVar32 = 0x90;
      lVar28 = 0;
      local_388 = uVar31;
      do {
        if (paVar6->mColors[lVar28] == (aiColor4D *)0x0) break;
        operator_delete__(paVar6->mColors[lVar28]);
        uVar30 = paVar6->mNumVertices;
        uVar31 = (ulong)uVar30 << 4;
        paVar24 = (aiColor4D *)operator_new__(uVar31);
        if (uVar30 != 0) {
          memset(paVar24,0,uVar31);
        }
        paVar6->mColors[lVar28] = paVar24;
        if (paVar6->mNumVertices != 0) {
          lVar29 = 0;
          uVar31 = 0;
          lVar25 = lVar32;
          do {
            puVar2 = (undefined4 *)
                     ((long)&(((Vertex *)
                              (((pvVar4->
                                super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>)
                                ._M_impl.super__Vector_impl_data._M_start)->texcoords + -4))->
                             position).x + lVar25);
            uVar10 = puVar2[1];
            uVar11 = puVar2[2];
            uVar12 = puVar2[3];
            puVar3 = (undefined4 *)((long)&paVar6->mColors[lVar28]->r + lVar29);
            *puVar3 = *puVar2;
            puVar3[1] = uVar10;
            puVar3[2] = uVar11;
            puVar3[3] = uVar12;
            uVar31 = uVar31 + 1;
            lVar29 = lVar29 + 0x10;
            lVar25 = lVar25 + 0x110;
          } while (uVar31 < paVar6->mNumVertices);
        }
        lVar28 = lVar28 + 1;
        lVar32 = lVar32 + 0x10;
      } while (lVar28 != 8);
      lVar28 = 0x30;
      lVar32 = 0;
      do {
        if (paVar6->mTextureCoords[lVar32] == (aiVector3D *)0x0) break;
        operator_delete__(paVar6->mTextureCoords[lVar32]);
        uVar30 = paVar6->mNumVertices;
        uVar31 = (ulong)uVar30 * 0xc;
        paVar23 = (aiVector3D *)operator_new__(uVar31);
        if (uVar30 != 0) {
          memset(paVar23,0,((uVar31 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mTextureCoords[lVar32] = paVar23;
        if (paVar6->mNumVertices != 0) {
          lVar29 = 0;
          uVar31 = 0;
          lVar25 = lVar28;
          do {
            pVVar7 = (pvVar4->super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar23 = paVar6->mTextureCoords[lVar32];
            *(undefined4 *)((long)&paVar23->z + lVar29) =
                 *(undefined4 *)((long)pVVar7->texcoords + lVar25 + -0x28);
            *(undefined8 *)((long)&paVar23->x + lVar29) =
                 *(undefined8 *)((long)&(((Vertex *)(pVVar7->texcoords + -4))->position).x + lVar25)
            ;
            uVar31 = uVar31 + 1;
            lVar29 = lVar29 + 0xc;
            lVar25 = lVar25 + 0x110;
          } while (uVar31 < paVar6->mNumVertices);
        }
        lVar32 = lVar32 + 1;
        lVar28 = lVar28 + 0xc;
      } while (lVar32 != 8);
      uVar31 = local_388 + 1;
      paVar27 = local_3a8;
    } while (uVar31 < local_3a8->mNumAnimMeshes);
  }
  if (paVar27->mNumFaces != 0) {
    uVar31 = 0;
    do {
      if (paVar27->mFaces[uVar31].mNumIndices != 0) {
        paVar35 = paVar27->mFaces + uVar31;
        uVar36 = 0;
        do {
          puVar8 = paVar35->mIndices;
          puVar8[uVar36] =
               local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[puVar8[uVar36]] & 0x7fffffff;
          uVar36 = uVar36 + 1;
        } while (uVar36 < paVar35->mNumIndices);
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 < paVar27->mNumFaces);
  }
  if (0 < (int)paVar27->mNumBones) {
    lVar32 = 0;
    do {
      paVar9 = paVar27->mBones[lVar32];
      local_2e8 = (undefined1  [8])0x0;
      paStack_2e0 = (aiVertexWeight *)0x0;
      local_2d8 = (aiVertexWeight *)0x0;
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_2e8,
                 (ulong)paVar9->mNumWeights);
      if (paVar9->mWeights == (aiVertexWeight *)0x0) {
        pLVar21 = DefaultLogger::get();
        Logger::error(pLVar21,"X-Export: aiBone shall contain weights, but pointer to them is NULL."
                     );
      }
      else if (paVar9->mNumWeights != 0) {
        uVar31 = 0;
        do {
          paVar26 = paVar9->mWeights;
          if (-1 < (int)local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[paVar26[uVar31].mVertexId]) {
            local_140.position.y = paVar26[uVar31].mWeight;
            local_140.position.x =
                 (float)local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[paVar26[uVar31].mVertexId];
            if (paStack_2e0 == local_2d8) {
              std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
              _M_realloc_insert<aiVertexWeight_const&>
                        ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)local_2e8,
                         (iterator)paStack_2e0,(aiVertexWeight *)&local_140);
            }
            else {
              paStack_2e0->mVertexId =
                   local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[paVar26[uVar31].mVertexId];
              paStack_2e0->mWeight = local_140.position.y;
              paStack_2e0 = paStack_2e0 + 1;
            }
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 < paVar9->mNumWeights);
      }
      if ((undefined1  [8])paStack_2e0 != local_2e8) {
        if (paVar9->mWeights != (aiVertexWeight *)0x0) {
          operator_delete__(paVar9->mWeights);
        }
        __src = local_2e8;
        uVar36 = (long)paStack_2e0 - (long)local_2e8 >> 3;
        paVar9->mNumWeights = (uint)uVar36;
        uVar36 = uVar36 & 0xffffffff;
        uVar31 = uVar36 * 8;
        paVar26 = (aiVertexWeight *)operator_new__(uVar31);
        if (uVar36 != 0) {
          memset(paVar26,0,uVar31);
        }
        paVar9->mWeights = paVar26;
        memcpy(paVar26,(void *)__src,(ulong)paVar9->mNumWeights << 3);
      }
      paVar27 = local_3a8;
      if (local_2e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 < (int)paVar27->mNumBones);
  }
  uVar30 = paVar27->mNumVertices;
  std::
  vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  ::~vector(&local_348);
  if (local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  SpatialSort::~SpatialSort(&local_168);
  if (local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_360.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c8.super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c8.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.
                          super__Vector_base<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_320);
  return uVar30;
  while (uVar31 = uVar31 + 1, uVar31 != 8) {
LAB_003058ec:
    if (paVar27->mTextureCoords[uVar31] == (aiVector3D *)0x0) {
      bVar15 = 1 < uVar31;
      break;
    }
  }
  goto LAB_00305907;
}

Assistant:

int JoinVerticesProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshIndex)
{
    static_assert( AI_MAX_NUMBER_OF_COLOR_SETS    == 8, "AI_MAX_NUMBER_OF_COLOR_SETS    == 8");
	static_assert( AI_MAX_NUMBER_OF_TEXTURECOORDS == 8, "AI_MAX_NUMBER_OF_TEXTURECOORDS == 8");

    // Return early if we don't have any positions
    if (!pMesh->HasPositions() || !pMesh->HasFaces()) {
        return 0;
    }

    // We should care only about used vertices, not all of them
    // (this can happen due to original file vertices buffer being used by
    // multiple meshes)
    std::unordered_set<unsigned int> usedVertexIndices;
    usedVertexIndices.reserve(pMesh->mNumVertices);
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for( unsigned int b = 0; b < face.mNumIndices; b++) {
            usedVertexIndices.insert(face.mIndices[b]);
        }
    }

    // We'll never have more vertices afterwards.
    std::vector<Vertex> uniqueVertices;
    uniqueVertices.reserve( pMesh->mNumVertices);

    // For each vertex the index of the vertex it was replaced by.
    // Since the maximal number of vertices is 2^31-1, the most significand bit can be used to mark
    //  whether a new vertex was created for the index (true) or if it was replaced by an existing
    //  unique vertex (false). This saves an additional std::vector<bool> and greatly enhances
    //  branching performance.
    static_assert(AI_MAX_VERTICES == 0x7fffffff, "AI_MAX_VERTICES == 0x7fffffff");
    std::vector<unsigned int> replaceIndex( pMesh->mNumVertices, 0xffffffff);

    // float posEpsilonSqr;
    SpatialSort* vertexFinder = NULL;
    SpatialSort _vertexFinder;

    typedef std::pair<SpatialSort,float> SpatPair;
    if (shared) {
        std::vector<SpatPair >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)    {
            SpatPair& blubb = (*avf)[meshIndex];
            vertexFinder  = &blubb.first;
            // posEpsilonSqr = blubb.second;
        }
    }
    if (!vertexFinder)  {
        // bad, need to compute it.
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        // posEpsilonSqr = ComputePositionEpsilon(pMesh);
    }

    // Again, better waste some bytes than a realloc ...
    std::vector<unsigned int> verticesFound;
    verticesFound.reserve(10);

    // Run an optimized code path if we don't have multiple UVs or vertex colors.
    // This should yield false in more than 99% of all imports ...
    const bool complex = ( pMesh->GetNumColorChannels() > 0 || pMesh->GetNumUVChannels() > 1);
    const bool hasAnimMeshes = pMesh->mNumAnimMeshes > 0;

    // We'll never have more vertices afterwards.
    std::vector<std::vector<Vertex>> uniqueAnimatedVertices;
    if (hasAnimMeshes) {
        uniqueAnimatedVertices.resize(pMesh->mNumAnimMeshes);
        for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
            uniqueAnimatedVertices[animMeshIndex].reserve(pMesh->mNumVertices);
        }
    }

    // Now check each vertex if it brings something new to the table
    for( unsigned int a = 0; a < pMesh->mNumVertices; a++)  {
        if (usedVertexIndices.find(a) == usedVertexIndices.end()) {
            continue;
        }

        // collect the vertex data
        Vertex v(pMesh,a);

        // collect all vertices that are close enough to the given position
        vertexFinder->FindIdenticalPositions( v.position, verticesFound);
        unsigned int matchIndex = 0xffffffff;

        // check all unique vertices close to the position if this vertex is already present among them
        for( unsigned int b = 0; b < verticesFound.size(); b++) {
            const unsigned int vidx = verticesFound[b];
            const unsigned int uidx = replaceIndex[ vidx];
            if( uidx & 0x80000000)
                continue;

            const Vertex& uv = uniqueVertices[ uidx];

            if (!areVerticesEqual(v, uv, complex)) {
                continue;
            }

            if (hasAnimMeshes) {
                // If given vertex is animated, then it has to be preserver 1 to 1 (base mesh and animated mesh require same topology)
                // NOTE: not doing this totaly breaks anim meshes as they don't have their own faces (they use pMesh->mFaces)
                bool breaksAnimMesh = false;
                for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
                    const Vertex& animatedUV = uniqueAnimatedVertices[animMeshIndex][ uidx];
                    Vertex aniMeshVertex(pMesh->mAnimMeshes[animMeshIndex], a);
                    if (!areVerticesEqual(aniMeshVertex, animatedUV, complex)) {
                        breaksAnimMesh = true;
                        break;
                    }
                }
                if (breaksAnimMesh) {
                    continue;
                }
            }

            // we're still here -> this vertex perfectly matches our given vertex
            matchIndex = uidx;
            break;
        }

        // found a replacement vertex among the uniques?
        if( matchIndex != 0xffffffff)
        {
            // store where to found the matching unique vertex
            replaceIndex[a] = matchIndex | 0x80000000;
        }
        else
        {
            // no unique vertex matches it up to now -> so add it
            replaceIndex[a] = (unsigned int)uniqueVertices.size();
            uniqueVertices.push_back( v);
            if (hasAnimMeshes) {
                for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
                    Vertex aniMeshVertex(pMesh->mAnimMeshes[animMeshIndex], a);
                    uniqueAnimatedVertices[animMeshIndex].push_back(aniMeshVertex);
                }
            }
        }
    }

    if (!DefaultLogger::isNullLogger() && DefaultLogger::get()->getLogSeverity() == Logger::VERBOSE)    {
        ASSIMP_LOG_DEBUG_F(
            "Mesh ",meshIndex,
            " (",
            (pMesh->mName.length ? pMesh->mName.data : "unnamed"),
            ") | Verts in: ",pMesh->mNumVertices,
            " out: ",
            uniqueVertices.size(),
            " | ~",
            ((pMesh->mNumVertices - uniqueVertices.size()) / (float)pMesh->mNumVertices) * 100.f,
            "%"
        );
    }

    updateXMeshVertices(pMesh, uniqueVertices);
    if (hasAnimMeshes) {
        for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
            updateXMeshVertices(pMesh->mAnimMeshes[animMeshIndex], uniqueAnimatedVertices[animMeshIndex]);
        }
    }

    // adjust the indices in all faces
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for( unsigned int b = 0; b < face.mNumIndices; b++) {
            face.mIndices[b] = replaceIndex[face.mIndices[b]] & ~0x80000000;
        }
    }

    // adjust bone vertex weights.
    for( int a = 0; a < (int)pMesh->mNumBones; a++) {
        aiBone* bone = pMesh->mBones[a];
        std::vector<aiVertexWeight> newWeights;
        newWeights.reserve( bone->mNumWeights);

        if ( NULL != bone->mWeights ) {
            for ( unsigned int b = 0; b < bone->mNumWeights; b++ ) {
                const aiVertexWeight& ow = bone->mWeights[ b ];
                // if the vertex is a unique one, translate it
                if ( !( replaceIndex[ ow.mVertexId ] & 0x80000000 ) ) {
                    aiVertexWeight nw;
                    nw.mVertexId = replaceIndex[ ow.mVertexId ];
                    nw.mWeight = ow.mWeight;
                    newWeights.push_back( nw );
                }
            }
        } else {
            ASSIMP_LOG_ERROR( "X-Export: aiBone shall contain weights, but pointer to them is NULL." );
        }

        if (newWeights.size() > 0) {
            // kill the old and replace them with the translated weights
            delete [] bone->mWeights;
            bone->mNumWeights = (unsigned int)newWeights.size();

            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            memcpy( bone->mWeights, &newWeights[0], bone->mNumWeights * sizeof( aiVertexWeight));
        }
    }
    return pMesh->mNumVertices;
}